

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colmatrix_test.cc
# Opt level: O2

void __thiscall fizplex::ColMatrix_SwapColumns_Test::TestBody(ColMatrix_SwapColumns_Test *this)

{
  vector<fizplex::SVector::Nonzero,_std::allocator<fizplex::SVector::Nonzero>_> *pvVar1;
  SVector *pSVar2;
  long lVar3;
  char *pcVar4;
  initializer_list<fizplex::SVector::Nonzero> l;
  initializer_list<fizplex::SVector::Nonzero> l_00;
  initializer_list<fizplex::SVector::Nonzero> l_01;
  initializer_list<fizplex::SVector> colList;
  AssertHelper local_110;
  Nonzero local_108;
  undefined8 local_f8;
  undefined8 uStack_f0;
  AssertionResult gtest_ar;
  ColMatrix m;
  SVector v0;
  SVector local_78;
  SVector local_60;
  SVector v2;
  
  local_f8 = 2;
  uStack_f0 = 0xc008000000000000;
  local_108.index = 0;
  local_108.value = 7.0;
  l._M_len = 2;
  l._M_array = &local_108;
  SVector::SVector(&v0,l);
  v2.values.
  super__Vector_base<fizplex::SVector::Nonzero,_std::allocator<fizplex::SVector::Nonzero>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x1;
  v2.values.
  super__Vector_base<fizplex::SVector::Nonzero,_std::allocator<fizplex::SVector::Nonzero>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  v2.values.
  super__Vector_base<fizplex::SVector::Nonzero,_std::allocator<fizplex::SVector::Nonzero>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x4000000000000000;
  l_00._M_len = 3;
  l_00._M_array = (iterator)&v2;
  SVector::SVector(&local_78,l_00);
  gtest_ar.success_ = false;
  gtest_ar._1_7_ = 0;
  gtest_ar.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&DAT_3ff0000000000000;
  l_01._M_len = 3;
  l_01._M_array = (iterator)&gtest_ar;
  SVector::SVector(&local_60,l_01);
  colList._M_len = 3;
  colList._M_array = &v0;
  ColMatrix::ColMatrix(&m,3,3,colList);
  lVar3 = 0x30;
  do {
    std::_Vector_base<fizplex::SVector::Nonzero,_std::allocator<fizplex::SVector::Nonzero>_>::
    ~_Vector_base((_Vector_base<fizplex::SVector::Nonzero,_std::allocator<fizplex::SVector::Nonzero>_>
                   *)((long)&v0.values.
                             super__Vector_base<fizplex::SVector::Nonzero,_std::allocator<fizplex::SVector::Nonzero>_>
                             ._M_impl.super__Vector_impl_data._M_start + lVar3));
    lVar3 = lVar3 + -0x18;
  } while (lVar3 != -0x18);
  pvVar1 = &ColMatrix::column(&m,0)->values;
  std::vector<fizplex::SVector::Nonzero,_std::allocator<fizplex::SVector::Nonzero>_>::vector
            (&v0.values,pvVar1);
  pvVar1 = &ColMatrix::column(&m,2)->values;
  std::vector<fizplex::SVector::Nonzero,_std::allocator<fizplex::SVector::Nonzero>_>::vector
            (&v2.values,pvVar1);
  ColMatrix::swap_columns(&m,0,2);
  pSVar2 = ColMatrix::column(&m,0);
  testing::internal::CmpHelperEQ<fizplex::SVector,fizplex::SVector>
            ((internal *)&gtest_ar,"v2","m.column(0)",&v2,pSVar2);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_108);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_110,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LeFiz[P]Fizplex/src/colmatrix_test.cc"
               ,0x54,pcVar4);
    testing::internal::AssertHelper::operator=(&local_110,(Message *)&local_108);
    testing::internal::AssertHelper::~AssertHelper(&local_110);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_108);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  pSVar2 = ColMatrix::column(&m,2);
  testing::internal::CmpHelperEQ<fizplex::SVector,fizplex::SVector>
            ((internal *)&gtest_ar,"v0","m.column(2)",&v0,pSVar2);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_108);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_110,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LeFiz[P]Fizplex/src/colmatrix_test.cc"
               ,0x55,pcVar4);
    testing::internal::AssertHelper::operator=(&local_110,(Message *)&local_108);
    testing::internal::AssertHelper::~AssertHelper(&local_110);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_108);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  std::_Vector_base<fizplex::SVector::Nonzero,_std::allocator<fizplex::SVector::Nonzero>_>::
  ~_Vector_base((_Vector_base<fizplex::SVector::Nonzero,_std::allocator<fizplex::SVector::Nonzero>_>
                 *)&v2);
  std::_Vector_base<fizplex::SVector::Nonzero,_std::allocator<fizplex::SVector::Nonzero>_>::
  ~_Vector_base((_Vector_base<fizplex::SVector::Nonzero,_std::allocator<fizplex::SVector::Nonzero>_>
                 *)&v0);
  std::vector<fizplex::SVector,_std::allocator<fizplex::SVector>_>::~vector(&m.cols);
  return;
}

Assistant:

TEST(ColMatrix, SwapColumns) {
  ColMatrix m(3, 3,
              {{{0, 7}, {2, -3}},
               {{0, 2}, {1, 3}, {2, 4}},
               {{0, 1}, {1, -1}, {2, -2}}});
  const SVector v0 = m.column(0);
  const SVector v2 = m.column(2);
  m.swap_columns(0, 2);
  EXPECT_EQ(v2, m.column(0));
  EXPECT_EQ(v0, m.column(2));
}